

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool __thiscall ON_SubD::IsManifold(ON_SubD *this,bool *bIsOriented,bool *bHasBoundary)

{
  element_type *peVar1;
  ON_SubDLevel *level;
  bool bIsManifold;
  int solid_orientation;
  bool local_d;
  int local_c;
  
  local_d = false;
  *bIsOriented = false;
  *bHasBoundary = false;
  local_c = 0;
  peVar1 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar1 == (element_type *)0x0) ||
     (level = peVar1->m_active_level, level == (ON_SubDLevel *)0x0)) {
    level = &ON_SubDLevel::Empty;
  }
  ON_SubDAggregates::GetTopologicalAttributes
            (&level->m_aggregates,level,&local_d,bIsOriented,bHasBoundary,&local_c);
  return local_d;
}

Assistant:

bool ON_SubD::IsManifold( bool& bIsOriented, bool& bHasBoundary ) const
{
  bool bIsManifold = false;
  bIsOriented = false;
  bHasBoundary = false;
  int solid_orientation = 0;
  ActiveLevel().GetTopologicalAttributes(bIsManifold, bIsOriented, bHasBoundary, solid_orientation);
  return bIsManifold;
}